

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_12x12(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  JSAMPLE *pJVar5;
  void *pvVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  int aiStack_1b8 [98];
  
  pJVar5 = cinfo->sample_range_limit;
  pvVar6 = compptr->dct_table;
  lVar19 = 0;
  do {
    lVar10 = (long)*(short *)((long)pvVar6 + lVar19 * 2) * (long)coef_block[lVar19] * 0x2000;
    lVar11 = (long)*(short *)((long)pvVar6 + lVar19 * 2 + 0x40) * (long)coef_block[lVar19 + 0x20];
    lVar25 = lVar11 * 0x2731 + lVar10 + 0x400;
    lVar28 = lVar10 + 0x400 + lVar11 * -0x2731;
    lVar11 = (long)*(short *)((long)pvVar6 + lVar19 * 2 + 0x20) * (long)coef_block[lVar19 + 0x10];
    lVar21 = (long)*(short *)((long)pvVar6 + lVar19 * 2 + 0x60) * (long)coef_block[lVar19 + 0x30];
    lVar31 = (lVar11 - lVar21) * 0x2000 + lVar10 + 0x400;
    lVar32 = lVar10 + 0x400 + (lVar11 - lVar21) * -0x2000;
    lVar10 = lVar11 * 0x2bb6 + lVar21 * 0x2000;
    lVar26 = lVar25 + lVar10;
    lVar25 = lVar25 - lVar10;
    lVar11 = lVar11 * 0xbb6 + lVar21 * -0x2000;
    lVar10 = lVar11 + lVar28;
    lVar28 = lVar28 - lVar11;
    lVar29 = (long)*(short *)((long)pvVar6 + lVar19 * 2 + 0x10) * (long)coef_block[lVar19 + 8];
    lVar14 = (long)*(short *)((long)pvVar6 + lVar19 * 2 + 0x30) * (long)coef_block[lVar19 + 0x18];
    lVar17 = (long)*(short *)((long)pvVar6 + lVar19 * 2 + 0x50) * (long)coef_block[lVar19 + 0x28];
    lVar12 = (long)*(short *)((long)pvVar6 + lVar19 * 2 + 0x70) * (long)coef_block[lVar19 + 0x38];
    lVar21 = (lVar12 + lVar17 + lVar29) * 0x1b8d;
    lVar33 = (lVar17 + lVar29) * 0x85b + lVar21;
    lVar22 = lVar29 * 0x8f7 + lVar14 * 0x29cf + lVar33;
    lVar11 = (lVar12 + lVar17) * -0x2175;
    lVar33 = lVar17 * -0x2f50 + lVar14 * -0x1151 + lVar11 + lVar33;
    lVar34 = lVar12 * 0x32c6 + lVar14 * -0x29cf + lVar11 + lVar21;
    lVar21 = lVar12 * -0x3f74 + lVar29 * -0x15a4 + lVar14 * -0x1151 + lVar21;
    lVar11 = ((lVar29 - lVar12) + (lVar14 - lVar17)) * 0x1151;
    lVar12 = (lVar29 - lVar12) * 0x187e + lVar11;
    lVar11 = (lVar14 - lVar17) * -0x3b21 + lVar11;
    aiStack_1b8[lVar19] = (int)((ulong)(lVar22 + lVar26) >> 0xb);
    aiStack_1b8[lVar19 + 0x58] = (int)((ulong)(lVar26 - lVar22) >> 0xb);
    aiStack_1b8[lVar19 + 8] = (int)((ulong)(lVar12 + lVar31) >> 0xb);
    aiStack_1b8[lVar19 + 0x50] = (int)((ulong)(lVar31 - lVar12) >> 0xb);
    aiStack_1b8[lVar19 + 0x10] = (int)((ulong)(lVar33 + lVar10) >> 0xb);
    aiStack_1b8[lVar19 + 0x48] = (int)((ulong)(lVar10 - lVar33) >> 0xb);
    aiStack_1b8[lVar19 + 0x18] = (int)((ulong)(lVar34 + lVar28) >> 0xb);
    aiStack_1b8[lVar19 + 0x40] = (int)((ulong)(lVar28 - lVar34) >> 0xb);
    aiStack_1b8[lVar19 + 0x20] = (int)((ulong)(lVar32 + lVar11) >> 0xb);
    aiStack_1b8[lVar19 + 0x38] = (int)((ulong)(lVar32 - lVar11) >> 0xb);
    aiStack_1b8[lVar19 + 0x28] = (int)((ulong)(lVar21 + lVar25) >> 0xb);
    aiStack_1b8[lVar19 + 0x30] = (int)((ulong)(lVar25 - lVar21) >> 0xb);
    lVar19 = lVar19 + 1;
  } while ((int)lVar19 != 8);
  uVar9 = (ulong)output_col;
  lVar19 = 0;
  do {
    iVar8 = aiStack_1b8[lVar19 + 1];
    iVar23 = aiStack_1b8[lVar19] * 0x2000;
    iVar2 = aiStack_1b8[lVar19 + 2];
    iVar30 = aiStack_1b8[lVar19 + 6];
    iVar18 = iVar23 + aiStack_1b8[lVar19 + 4] * 0x2731 + 0x20000;
    iVar20 = (iVar2 - iVar30) * 0x2000 + iVar23 + 0x20000;
    iVar15 = iVar2 * 0x2bb6 + iVar30 * 0x2000;
    iVar1 = iVar15 + iVar18;
    iVar7 = iVar2 * 0xbb6 + iVar30 * -0x2000;
    iVar18 = iVar18 - iVar15;
    iVar15 = aiStack_1b8[lVar19 + 3];
    iVar3 = aiStack_1b8[lVar19 + 5];
    iVar4 = aiStack_1b8[lVar19 + 7];
    iVar24 = iVar23 + 0x20000 + (iVar2 - iVar30) * -0x2000;
    iVar16 = (iVar4 + iVar3 + iVar8) * 0x1b8d;
    iVar30 = (iVar3 + iVar8) * 0x85b + iVar16;
    iVar27 = iVar23 + 0x20000 + aiStack_1b8[lVar19 + 4] * -0x2731;
    iVar13 = iVar8 * 0x8f7 + iVar15 * 0x29cf + iVar30;
    iVar23 = (iVar4 + iVar3) * -0x2175;
    iVar30 = iVar3 * -0x2f50 + iVar15 * -0x1151 + iVar23 + iVar30;
    iVar2 = iVar7 + iVar27;
    iVar27 = iVar27 - iVar7;
    iVar23 = iVar4 * 0x32c6 + iVar15 * -0x29cf + iVar23 + iVar16;
    iVar16 = iVar4 * -0x3f74 + iVar8 * -0x15a4 + iVar15 * -0x1151 + iVar16;
    iVar7 = ((iVar8 - iVar4) + (iVar15 - iVar3)) * 0x1151;
    iVar8 = (iVar8 - iVar4) * 0x187e + iVar7;
    iVar7 = (iVar15 - iVar3) * -0x3b21 + iVar7;
    lVar10 = *(long *)((long)output_buf + lVar19);
    *(JSAMPLE *)(lVar10 + uVar9) = pJVar5[(ulong)((uint)(iVar1 + iVar13) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 0xb + uVar9) =
         pJVar5[(ulong)((uint)(iVar1 - iVar13) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 1 + uVar9) =
         pJVar5[(ulong)((uint)(iVar8 + iVar20) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 10 + uVar9) =
         pJVar5[(ulong)((uint)(iVar20 - iVar8) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 2 + uVar9) =
         pJVar5[(ulong)((uint)(iVar30 + iVar2) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 9 + uVar9) =
         pJVar5[(ulong)((uint)(iVar2 - iVar30) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 3 + uVar9) =
         pJVar5[(ulong)((uint)(iVar27 + iVar23) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 8 + uVar9) =
         pJVar5[(ulong)((uint)(iVar27 - iVar23) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 4 + uVar9) =
         pJVar5[(ulong)((uint)(iVar7 + iVar24) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 7 + uVar9) =
         pJVar5[(ulong)((uint)(iVar24 - iVar7) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 5 + uVar9) =
         pJVar5[(ulong)((uint)(iVar16 + iVar18) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 6 + uVar9) =
         pJVar5[(ulong)((uint)(iVar18 - iVar16) >> 0x12 & 0x3ff) + 0x80];
    lVar19 = lVar19 + 8;
  } while (lVar19 != 0x60);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_12x12(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14, tmp15;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 12];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    z3 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    z3 = LEFT_SHIFT(z3, CONST_BITS);
    /* Add fudge factor here for final descale. */
    z3 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z4 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z4 = MULTIPLY(z4, FIX(1.224744871)); /* c4 */

    tmp10 = z3 + z4;
    tmp11 = z3 - z4;

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z4 = MULTIPLY(z1, FIX(1.366025404)); /* c2 */
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);
    z2 = LEFT_SHIFT(z2, CONST_BITS);

    tmp12 = z1 - z2;

    tmp21 = z3 + tmp12;
    tmp24 = z3 - tmp12;

    tmp12 = z4 + z2;

    tmp20 = tmp10 + tmp12;
    tmp25 = tmp10 - tmp12;

    tmp12 = z4 - z1 - z2;

    tmp22 = tmp11 + tmp12;
    tmp23 = tmp11 - tmp12;

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = MULTIPLY(z2, FIX(1.306562965));                  /* c3 */
    tmp14 = MULTIPLY(z2, -FIX_0_541196100);                  /* -c9 */

    tmp10 = z1 + z3;
    tmp15 = MULTIPLY(tmp10 + z4, FIX(0.860918669));          /* c7 */
    tmp12 = tmp15 + MULTIPLY(tmp10, FIX(0.261052384));       /* c5-c7 */
    tmp10 = tmp12 + tmp11 + MULTIPLY(z1, FIX(0.280143716));  /* c1-c5 */
    tmp13 = MULTIPLY(z3 + z4, -FIX(1.045510580));            /* -(c7+c11) */
    tmp12 += tmp13 + tmp14 - MULTIPLY(z3, FIX(1.478575242)); /* c1+c5-c7-c11 */
    tmp13 += tmp15 - tmp11 + MULTIPLY(z4, FIX(1.586706681)); /* c1+c11 */
    tmp15 += tmp14 - MULTIPLY(z1, FIX(0.676326758)) -        /* c7-c11 */
             MULTIPLY(z4, FIX(1.982889723));                 /* c5+c7 */

    z1 -= z4;
    z2 -= z3;
    z3 = MULTIPLY(z1 + z2, FIX_0_541196100);                 /* c9 */
    tmp11 = z3 + MULTIPLY(z1, FIX_0_765366865);              /* c3-c9 */
    tmp14 = z3 - MULTIPLY(z2, FIX_1_847759065);              /* c3+c9 */

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 11] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25 + tmp15, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp25 - tmp15, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 12 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 12; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    z3 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    z3 = LEFT_SHIFT(z3, CONST_BITS);

    z4 = (JLONG)wsptr[4];
    z4 = MULTIPLY(z4, FIX(1.224744871)); /* c4 */

    tmp10 = z3 + z4;
    tmp11 = z3 - z4;

    z1 = (JLONG)wsptr[2];
    z4 = MULTIPLY(z1, FIX(1.366025404)); /* c2 */
    z1 = LEFT_SHIFT(z1, CONST_BITS);
    z2 = (JLONG)wsptr[6];
    z2 = LEFT_SHIFT(z2, CONST_BITS);

    tmp12 = z1 - z2;

    tmp21 = z3 + tmp12;
    tmp24 = z3 - tmp12;

    tmp12 = z4 + z2;

    tmp20 = tmp10 + tmp12;
    tmp25 = tmp10 - tmp12;

    tmp12 = z4 - z1 - z2;

    tmp22 = tmp11 + tmp12;
    tmp23 = tmp11 - tmp12;

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    tmp11 = MULTIPLY(z2, FIX(1.306562965));                  /* c3 */
    tmp14 = MULTIPLY(z2, -FIX_0_541196100);                  /* -c9 */

    tmp10 = z1 + z3;
    tmp15 = MULTIPLY(tmp10 + z4, FIX(0.860918669));          /* c7 */
    tmp12 = tmp15 + MULTIPLY(tmp10, FIX(0.261052384));       /* c5-c7 */
    tmp10 = tmp12 + tmp11 + MULTIPLY(z1, FIX(0.280143716));  /* c1-c5 */
    tmp13 = MULTIPLY(z3 + z4, -FIX(1.045510580));            /* -(c7+c11) */
    tmp12 += tmp13 + tmp14 - MULTIPLY(z3, FIX(1.478575242)); /* c1+c5-c7-c11 */
    tmp13 += tmp15 - tmp11 + MULTIPLY(z4, FIX(1.586706681)); /* c1+c11 */
    tmp15 += tmp14 - MULTIPLY(z1, FIX(0.676326758)) -        /* c7-c11 */
             MULTIPLY(z4, FIX(1.982889723));                 /* c5+c7 */

    z1 -= z4;
    z2 -= z3;
    z3 = MULTIPLY(z1 + z2, FIX_0_541196100);                 /* c9 */
    tmp11 = z3 + MULTIPLY(z1, FIX_0_765366865);              /* c3-c9 */
    tmp14 = z3 - MULTIPLY(z2, FIX_1_847759065);              /* c3+c9 */

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[11] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25 + tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp25 - tmp15,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}